

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

vector<void_*,_std::allocator<void_*>_> *
eglu::chooseConfigs(vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,Library *egl,
                   EGLDisplay display,AttribMap *attribs)

{
  const_reference attribList_00;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> attribList;
  AttribMap *attribs_local;
  EGLDisplay display_local;
  Library *egl_local;
  
  attribList.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)attribs;
  attribMapToList((vector<int,_std::allocator<int>_> *)local_40,attribs);
  attribList_00 =
       std::vector<int,_std::allocator<int>_>::front((vector<int,_std::allocator<int>_> *)local_40);
  chooseConfigs(__return_storage_ptr__,egl,display,attribList_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

vector<EGLConfig> chooseConfigs (const Library& egl, EGLDisplay display, const AttribMap& attribs)
{
	const vector<EGLint>	attribList	= attribMapToList(attribs);
	return chooseConfigs(egl, display, &attribList.front());
}